

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_4bytes.cpp
# Opt level: O3

Sketch * ConstructClMul4Bytes(int bits,int implementation)

{
  long lVar1;
  Sketch *pSVar2;
  result_type_conflict k1;
  uint64_t uVar3;
  uint64_t data;
  long in_FS_OFFSET;
  param_type local_13c8;
  random_device rng;
  
  rng.field_0._912_8_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bits == 0x20) {
    pSVar2 = (Sketch *)operator_new(0x40);
    pSVar2->m_implementation = implementation;
    pSVar2->m_bits = 0x20;
    pSVar2->_vptr_Sketch = (_func_int **)0x13947b0;
    pSVar2[1].m_canary = 0;
    pSVar2[1].m_implementation = 0;
    pSVar2[1].m_bits = 0;
    pSVar2[2]._vptr_Sketch = (_func_int **)0x0;
    std::random_device::random_device(&rng);
    local_13c8._M_a = 0;
    local_13c8._M_b = 0xffffffffffffffff;
    k1 = std::uniform_int_distribution<unsigned_long>::operator()
                   ((uniform_int_distribution<unsigned_long> *)&local_13c8,&rng,&local_13c8);
    data = 0x2000000000;
    do {
      uVar3 = SipHash(0x434c4d554c466c64,k1,data);
      data = data + 1;
    } while ((int)uVar3 == 0);
    *(int *)&pSVar2[2].m_canary = (int)uVar3;
    std::random_device::_M_fini();
  }
  else {
    pSVar2 = (Sketch *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar2;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMul4Bytes(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_25
    case 25: return new SketchImpl<Field25>(implementation, 25);
#endif
#ifdef ENABLE_FIELD_INT_26
    case 26: return new SketchImpl<Field26>(implementation, 26);
#endif
#ifdef ENABLE_FIELD_INT_27
    case 27: return new SketchImpl<Field27>(implementation, 27);
#endif
#ifdef ENABLE_FIELD_INT_29
    case 29: return new SketchImpl<Field29>(implementation, 29);
#endif
#ifdef ENABLE_FIELD_INT_31
    case 31: return new SketchImpl<Field31>(implementation, 31);
#endif
#ifdef ENABLE_FIELD_INT_32
    case 32: return new SketchImpl<Field32>(implementation, 32);
#endif
    }
    return nullptr;
}